

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O0

void png_write_tRNS(png_structrp png_ptr,png_const_bytep trans_alpha,png_const_color_16p tran,
                   int num_trans,int color_type)

{
  png_byte local_2e [2];
  png_byte local_2c [2];
  png_byte local_2a [2];
  int iStack_28;
  png_byte buf [6];
  int color_type_local;
  int num_trans_local;
  png_const_color_16p tran_local;
  png_const_bytep trans_alpha_local;
  png_structrp png_ptr_local;
  
  iStack_28 = color_type;
  buf._2_4_ = num_trans;
  if (color_type == 3) {
    if ((num_trans < 1) || ((int)(uint)png_ptr->num_palette < num_trans)) {
      png_app_warning(png_ptr,"Invalid number of transparent colors specified");
    }
    else {
      png_write_complete_chunk(png_ptr,0x74524e53,trans_alpha,(long)num_trans);
    }
  }
  else if (color_type == 0) {
    if ((int)(uint)tran->gray < 1 << (png_ptr->bit_depth & 0x1f)) {
      png_save_uint_16(local_2e,(uint)tran->gray);
      png_write_complete_chunk(png_ptr,0x74524e53,local_2e,2);
    }
    else {
      png_app_warning(png_ptr,"Ignoring attempt to write tRNS chunk out-of-range for bit_depth");
    }
  }
  else if (color_type == 2) {
    png_save_uint_16(local_2e,(uint)tran->red);
    png_save_uint_16(local_2c,(uint)tran->green);
    png_save_uint_16(local_2a,(uint)tran->blue);
    if ((png_ptr->bit_depth == '\b') &&
       ((local_2e[0] != '\0' || local_2c[0] != '\0') || local_2a[0] != '\0')) {
      png_app_warning(png_ptr,"Ignoring attempt to write 16-bit tRNS chunk when bit_depth is 8");
    }
    else {
      png_write_complete_chunk(png_ptr,0x74524e53,local_2e,6);
    }
  }
  else {
    png_app_warning(png_ptr,"Can\'t write tRNS with an alpha channel");
  }
  return;
}

Assistant:

void /* PRIVATE */
png_write_tRNS(png_structrp png_ptr, png_const_bytep trans_alpha,
    png_const_color_16p tran, int num_trans, int color_type)
{
   png_byte buf[6];

   png_debug(1, "in png_write_tRNS");

   if (color_type == PNG_COLOR_TYPE_PALETTE)
   {
      if (num_trans <= 0 || num_trans > (int)png_ptr->num_palette)
      {
         png_app_warning(png_ptr,
             "Invalid number of transparent colors specified");
         return;
      }

      /* Write the chunk out as it is */
      png_write_complete_chunk(png_ptr, png_tRNS, trans_alpha,
          (png_size_t)num_trans);
   }

   else if (color_type == PNG_COLOR_TYPE_GRAY)
   {
      /* One 16-bit value */
      if (tran->gray >= (1 << png_ptr->bit_depth))
      {
         png_app_warning(png_ptr,
             "Ignoring attempt to write tRNS chunk out-of-range for bit_depth");

         return;
      }

      png_save_uint_16(buf, tran->gray);
      png_write_complete_chunk(png_ptr, png_tRNS, buf, (png_size_t)2);
   }

   else if (color_type == PNG_COLOR_TYPE_RGB)
   {
      /* Three 16-bit values */
      png_save_uint_16(buf, tran->red);
      png_save_uint_16(buf + 2, tran->green);
      png_save_uint_16(buf + 4, tran->blue);
#ifdef PNG_WRITE_16BIT_SUPPORTED
      if (png_ptr->bit_depth == 8 && (buf[0] | buf[2] | buf[4]) != 0)
#else
      if ((buf[0] | buf[2] | buf[4]) != 0)
#endif
      {
         png_app_warning(png_ptr,
             "Ignoring attempt to write 16-bit tRNS chunk when bit_depth is 8");
         return;
      }

      png_write_complete_chunk(png_ptr, png_tRNS, buf, (png_size_t)6);
   }

   else
   {
      png_app_warning(png_ptr, "Can't write tRNS with an alpha channel");
   }
}